

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_dcbz(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 EA;
  TCGv_i32 arg3;
  TCGv_i32 tcgv_op;
  TCGv_i64 tcgv_addr;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  gen_set_access_type(ctx,0x60);
  EA = tcg_temp_new_i64(tcg_ctx_00);
  arg3 = tcg_const_i32_ppc64(tcg_ctx_00,ctx->opcode & 0x3ff000);
  gen_addr_reg_index(ctx,EA);
  gen_helper_dcbz(tcg_ctx_00,tcg_ctx_00->cpu_env,EA,arg3);
  tcg_temp_free_i64(tcg_ctx_00,EA);
  tcg_temp_free_i32(tcg_ctx_00,arg3);
  return;
}

Assistant:

static void gen_dcbz(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv tcgv_addr;
    TCGv_i32 tcgv_op;

    gen_set_access_type(ctx, ACCESS_CACHE);
    tcgv_addr = tcg_temp_new(tcg_ctx);
    tcgv_op = tcg_const_i32(tcg_ctx, ctx->opcode & 0x03FF000);
    gen_addr_reg_index(ctx, tcgv_addr);
    gen_helper_dcbz(tcg_ctx, tcg_ctx->cpu_env, tcgv_addr, tcgv_op);
    tcg_temp_free(tcg_ctx, tcgv_addr);
    tcg_temp_free_i32(tcg_ctx, tcgv_op);
}